

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any cs_impl::any::make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(void)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  proxy *in_RDI;
  
  if ((DAT_00257518 == 0) || (cs::global_thread_counter != 0)) {
    puVar1 = (undefined8 *)operator_new(0x58);
  }
  else {
    puVar1 = *(undefined8 **)(&holder<char>::allocator + DAT_00257518 * 8);
    DAT_00257518 = DAT_00257518 + -1;
  }
  *puVar1 = &PTR__holder_0024d6b8;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map
            ((_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)(puVar1 + 1),0);
  if ((DAT_00258550 == 0) || (cs::global_thread_counter != 0)) {
    puVar2 = (undefined1 *)operator_new(0x18);
  }
  else {
    puVar2 = (undefined1 *)(&cs::null_pointer)[DAT_00258550];
    DAT_00258550 = DAT_00258550 + -1;
  }
  *puVar2 = 0;
  *(undefined2 *)(puVar2 + 2) = 0;
  *(undefined8 *)(puVar2 + 8) = 1;
  *(undefined8 **)(puVar2 + 0x10) = puVar1;
  *(undefined1 **)in_RDI = puVar2;
  return (any)in_RDI;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}